

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O2

void __thiscall
llvm::cl::opt<(anonymous_namespace)::HelpPrinter,_true,_llvm::cl::parser<bool>_>::printOptionValue
          (opt<(anonymous_namespace)::HelpPrinter,_true,_llvm::cl::parser<bool>_> *this,
          size_t GlobalWidth,bool Force)

{
  undefined7 in_register_00000011;
  opt_storage<(anonymous_namespace)::HelpPrinter,_true,_true> *this_00;
  
  this_00 = &this->super_opt_storage<(anonymous_namespace)::HelpPrinter,_true,_true>;
  opt_storage<(anonymous_namespace)::HelpPrinter,_true,_true>::getValue(this_00);
  if ((int)CONCAT71(in_register_00000011,Force) != 0) {
    basic_parser_impl::printOptionNoValue
              ((basic_parser_impl *)this_00,&this->super_Option,GlobalWidth);
    return;
  }
  return;
}

Assistant:

void printOptionValue(size_t GlobalWidth, bool Force) const override {
    if (Force || this->getDefault().compare(this->getValue())) {
      cl::printOptionDiff<ParserClass>(*this, Parser, this->getValue(),
                                       this->getDefault(), GlobalWidth);
    }
  }